

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapIfaceTest_TryEmplace_Test::TestBody(DenseHashMapIfaceTest_TryEmplace_Test *this)

{
  bool bVar1;
  pointer this_00;
  AssertHelper *this_01;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  p;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  h;
  bool *in_stack_fffffffffffff508;
  AssertionResult *in_stack_fffffffffffff510;
  undefined7 in_stack_fffffffffffff518;
  undefined1 in_stack_fffffffffffff51f;
  hasher *in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff528;
  int in_stack_fffffffffffff52c;
  int line;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_fffffffffffff530;
  Type in_stack_fffffffffffff53c;
  Type type;
  AssertHelper *in_stack_fffffffffffff540;
  undefined7 in_stack_fffffffffffff570;
  undefined1 in_stack_fffffffffffff577;
  char *in_stack_fffffffffffff578;
  char *in_stack_fffffffffffff580;
  undefined7 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58f;
  undefined1 uVar2;
  AssertHelper *in_stack_fffffffffffff590;
  AssertionResult local_7f0 [2];
  undefined4 local_7cc;
  AssertionResult local_7c8 [2];
  undefined4 local_7a4;
  AssertionResult local_7a0 [2];
  undefined4 local_77c;
  AssertionResult local_778 [2];
  undefined4 local_758;
  undefined4 local_754;
  AssertionResult local_750 [2];
  undefined4 local_72c;
  AssertionResult local_728 [2];
  undefined4 local_704;
  AssertionResult local_700;
  string local_6f0 [48];
  AssertionResult local_6c0;
  undefined4 local_6ac;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  local_6a8;
  undefined4 local_674;
  AssertionResult local_670 [2];
  undefined4 local_64c;
  AssertionResult local_648 [2];
  undefined4 local_624;
  AssertionResult local_620 [2];
  undefined4 local_5fc;
  AssertionResult local_5f8 [2];
  undefined4 local_5d8;
  undefined4 local_5d4;
  AssertionResult local_5d0 [2];
  undefined4 local_5ac;
  AssertionResult local_5a8 [2];
  undefined4 local_584;
  AssertionResult local_580;
  string local_570 [55];
  byte local_539;
  AssertionResult local_538;
  A local_528;
  undefined4 local_524;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  local_520;
  undefined4 local_4ec;
  AssertionResult local_4e8 [2];
  undefined4 local_4c4;
  AssertionResult local_4c0 [2];
  undefined4 local_49c;
  AssertionResult local_498 [2];
  undefined4 local_474;
  AssertionResult local_470 [2];
  undefined4 local_450;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  undefined4 local_424;
  AssertionResult local_420 [2];
  undefined4 local_3fc;
  AssertionResult local_3f8;
  string local_3e8 [48];
  AssertionResult local_3b8;
  A local_3a8;
  undefined4 local_3a4;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  local_3a0;
  undefined4 local_36c;
  AssertionResult local_368 [2];
  undefined4 local_344;
  AssertionResult local_340 [2];
  undefined4 local_31c;
  AssertionResult local_318 [2];
  undefined4 local_2f4;
  AssertionResult local_2f0 [2];
  undefined4 local_2d0;
  undefined4 local_2cc;
  AssertionResult local_2c8 [2];
  undefined4 local_2a4;
  AssertionResult local_2a0 [2];
  undefined4 local_27c;
  AssertionResult local_278;
  string local_268 [55];
  byte local_231;
  AssertionResult local_230;
  undefined4 local_220;
  undefined4 local_21c;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  local_218;
  undefined4 local_1e4;
  AssertionResult local_1e0 [2];
  undefined4 local_1bc;
  AssertionResult local_1b8 [2];
  undefined4 local_194;
  AssertionResult local_190 [2];
  undefined4 local_16c;
  AssertionResult local_168 [2];
  undefined4 local_148;
  undefined4 local_144;
  AssertionResult local_140 [2];
  undefined4 local_11c;
  AssertionResult local_118 [2];
  undefined4 local_f4;
  AssertionResult local_f0;
  uint local_dc;
  string local_d8 [48];
  AssertionResult local_a8;
  undefined4 local_98;
  undefined4 local_94;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  local_90;
  undefined4 local_70;
  libc_allocator_with_realloc<std::pair<const_int,_A>_> local_5b [91];
  
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::dense_hash_map(in_stack_fffffffffffff530,
                   CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                   in_stack_fffffffffffff520,
                   (key_equal *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                   (allocator_type *)in_stack_fffffffffffff510);
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::~libc_allocator_with_realloc
            (local_5b);
  local_70 = 0;
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::set_empty_key((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                   *)in_stack_fffffffffffff510,(key_type *)in_stack_fffffffffffff508);
  A::reset();
  local_94 = 10;
  local_98 = 100;
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::try_emplace<int>((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                      *)in_stack_fffffffffffff520,
                     (key_type *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     (int *)in_stack_fffffffffffff510);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff510,in_stack_fffffffffffff508,(type *)0x1088b9b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff540);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,in_stack_fffffffffffff578,
               (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,(char *)in_stack_fffffffffffff530
               ,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff590,
               (Message *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff510);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x1088cc6);
  }
  local_dc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1088d57);
  if (local_dc == 0) {
    local_f4 = 10;
    google::
    dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
    ::operator->((dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                  *)0x1088d80);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
               (char *)in_stack_fffffffffffff520,
               (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
               (int *)in_stack_fffffffffffff510);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff540);
      testing::AssertionResult::failure_message((AssertionResult *)0x1088e26);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                 (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                 (char *)in_stack_fffffffffffff520);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff590,
                 (Message *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff510);
      testing::Message::~Message((Message *)0x1088e89);
    }
    local_dc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1088ef7);
    if (local_dc == 0) {
      local_11c = 100;
      google::
      dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
      ::operator->((dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                    *)0x1088f20);
      testing::internal::EqHelper::Compare<int,_A,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                 (char *)in_stack_fffffffffffff520,
                 (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                 (A *)in_stack_fffffffffffff510);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff540);
        testing::AssertionResult::failure_message((AssertionResult *)0x1088fca);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                   (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                   (char *)in_stack_fffffffffffff520);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffff590,
                   (Message *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff510);
        testing::Message::~Message((Message *)0x108902d);
      }
      local_dc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x108909b);
      if (local_dc == 0) {
        local_144 = 100;
        local_148 = 10;
        google::
        dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
        ::operator[]((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                      *)in_stack_fffffffffffff510,(key_type *)in_stack_fffffffffffff508);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                   (char *)in_stack_fffffffffffff520,
                   (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                   (int *)in_stack_fffffffffffff510);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff540);
          testing::AssertionResult::failure_message((AssertionResult *)0x108917d);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                     (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                     (char *)in_stack_fffffffffffff520);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffff590,
                     (Message *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff510);
          testing::Message::~Message((Message *)0x10891e0);
        }
        local_dc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x108924e);
        if (local_dc == 0) {
          local_16c = 0;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                     (char *)in_stack_fffffffffffff520,
                     (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     (int *)in_stack_fffffffffffff510);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffff540);
            testing::AssertionResult::failure_message((AssertionResult *)0x1089305);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                       (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                       (char *)in_stack_fffffffffffff520);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffff590,
                       (Message *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff510);
            testing::Message::~Message((Message *)0x1089368);
          }
          local_dc = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10893d6);
          if (local_dc == 0) {
            local_194 = 0;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                       (char *)in_stack_fffffffffffff520,
                       (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                       (int *)in_stack_fffffffffffff510);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffff540);
              testing::AssertionResult::failure_message((AssertionResult *)0x108948d);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                         (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                         (char *)in_stack_fffffffffffff520);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffff590,
                         (Message *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff510);
              testing::Message::~Message((Message *)0x10894f0);
            }
            local_dc = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x108955e);
            if (local_dc == 0) {
              local_1bc = 0;
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                         (char *)in_stack_fffffffffffff520,
                         (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                         (int *)in_stack_fffffffffffff510);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffff540);
                testing::AssertionResult::failure_message((AssertionResult *)0x1089615);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                           (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                           (char *)in_stack_fffffffffffff520);
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffff590,
                           (Message *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588))
                ;
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff510);
                testing::Message::~Message((Message *)0x1089678);
              }
              local_dc = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x10896e6);
              if (local_dc == 0) {
                local_1e4 = 0;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                           (char *)in_stack_fffffffffffff520,
                           (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                           (int *)in_stack_fffffffffffff510);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffff540);
                  testing::AssertionResult::failure_message((AssertionResult *)0x108979d);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                             (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                             (char *)in_stack_fffffffffffff520);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffff590,
                             (Message *)
                             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff510);
                  testing::Message::~Message((Message *)0x1089800);
                }
                local_dc = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x108986e);
                if (local_dc == 0) {
                  A::reset();
                  local_21c = 10;
                  local_220 = 0x65;
                  google::
                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                  ::try_emplace<int>((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                      *)in_stack_fffffffffffff520,
                                     (key_type *)
                                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                                     (int *)in_stack_fffffffffffff510);
                  std::
                  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                  ::operator=(&local_90,&local_218);
                  local_231 = ~local_90.second & 1;
                  testing::AssertionResult::AssertionResult<bool>
                            (in_stack_fffffffffffff510,in_stack_fffffffffffff508,(type *)0x1089903);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffff540);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((AssertionResult *)
                               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                               in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                               (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570)
                              );
                    std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                               (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                               (char *)in_stack_fffffffffffff520);
                    testing::internal::AssertHelper::operator=
                              (in_stack_fffffffffffff590,
                               (Message *)
                               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffff510);
                    std::__cxx11::string::~string(local_268);
                    testing::Message::~Message((Message *)0x1089a01);
                  }
                  local_dc = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1089a92);
                  if (local_dc == 0) {
                    local_27c = 10;
                    google::
                    dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                    ::operator->((dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                  *)0x1089abb);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528)
                               ,(char *)in_stack_fffffffffffff520,
                               (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                               (int *)in_stack_fffffffffffff510);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffff540);
                      testing::AssertionResult::failure_message((AssertionResult *)0x1089b61);
                      testing::internal::AssertHelper::AssertHelper
                                (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                 (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                                 (char *)in_stack_fffffffffffff520);
                      testing::internal::AssertHelper::operator=
                                (in_stack_fffffffffffff590,
                                 (Message *)
                                 CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffff510);
                      testing::Message::~Message((Message *)0x1089bc4);
                    }
                    local_dc = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1089c32);
                    if (local_dc == 0) {
                      local_2a4 = 100;
                      google::
                      dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                      ::operator->((dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                    *)0x1089c5b);
                      testing::internal::EqHelper::Compare<int,_A,_nullptr>
                                ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                 (char *)in_stack_fffffffffffff520,
                                 (int *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518
                                                ),(A *)in_stack_fffffffffffff510);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_fffffffffffff540);
                        testing::AssertionResult::failure_message((AssertionResult *)0x1089d05);
                        testing::internal::AssertHelper::AssertHelper
                                  (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                   (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                                   (char *)in_stack_fffffffffffff520);
                        testing::internal::AssertHelper::operator=
                                  (in_stack_fffffffffffff590,
                                   (Message *)
                                   CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)in_stack_fffffffffffff510);
                        testing::Message::~Message((Message *)0x1089d68);
                      }
                      local_dc = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1089dd6);
                      if (local_dc == 0) {
                        local_2cc = 100;
                        local_2d0 = 10;
                        google::
                        dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                        ::operator[]((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                      *)in_stack_fffffffffffff510,
                                     (key_type *)in_stack_fffffffffffff508);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                    in_stack_fffffffffffff528),
                                   (char *)in_stack_fffffffffffff520,
                                   (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                   in_stack_fffffffffffff518),
                                   (int *)in_stack_fffffffffffff510);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
                        if (!bVar1) {
                          testing::Message::Message((Message *)in_stack_fffffffffffff540);
                          testing::AssertionResult::failure_message((AssertionResult *)0x1089eb8);
                          testing::internal::AssertHelper::AssertHelper
                                    (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                     (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                                     (char *)in_stack_fffffffffffff520);
                          testing::internal::AssertHelper::operator=
                                    (in_stack_fffffffffffff590,
                                     (Message *)
                                     CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)in_stack_fffffffffffff510);
                          testing::Message::~Message((Message *)0x1089f1b);
                        }
                        local_dc = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1089f89);
                        if (local_dc == 0) {
                          local_2f4 = 0;
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                      in_stack_fffffffffffff528),
                                     (char *)in_stack_fffffffffffff520,
                                     (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                     in_stack_fffffffffffff518),
                                     (int *)in_stack_fffffffffffff510);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f0);
                          if (!bVar1) {
                            testing::Message::Message((Message *)in_stack_fffffffffffff540);
                            testing::AssertionResult::failure_message((AssertionResult *)0x108a040);
                            testing::internal::AssertHelper::AssertHelper
                                      (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                       (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                                       (char *)in_stack_fffffffffffff520);
                            testing::internal::AssertHelper::operator=
                                      (in_stack_fffffffffffff590,
                                       (Message *)
                                       CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588)
                                      );
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)in_stack_fffffffffffff510);
                            testing::Message::~Message((Message *)0x108a0a3);
                          }
                          local_dc = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x108a111);
                          if (local_dc == 0) {
                            local_31c = 0;
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                        in_stack_fffffffffffff528),
                                       (char *)in_stack_fffffffffffff520,
                                       (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                       in_stack_fffffffffffff518),
                                       (int *)in_stack_fffffffffffff510);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_318);
                            if (!bVar1) {
                              testing::Message::Message((Message *)in_stack_fffffffffffff540);
                              testing::AssertionResult::failure_message
                                        ((AssertionResult *)0x108a1c8);
                              testing::internal::AssertHelper::AssertHelper
                                        (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                         (char *)in_stack_fffffffffffff530,in_stack_fffffffffffff52c
                                         ,(char *)in_stack_fffffffffffff520);
                              testing::internal::AssertHelper::operator=
                                        (in_stack_fffffffffffff590,
                                         (Message *)
                                         CONCAT17(in_stack_fffffffffffff58f,
                                                  in_stack_fffffffffffff588));
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)in_stack_fffffffffffff510);
                              testing::Message::~Message((Message *)0x108a22b);
                            }
                            local_dc = (uint)!bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x108a299)
                            ;
                            if (local_dc == 0) {
                              local_344 = 0;
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                          in_stack_fffffffffffff528),
                                         (char *)in_stack_fffffffffffff520,
                                         (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                         in_stack_fffffffffffff518),
                                         (int *)in_stack_fffffffffffff510);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
                              if (!bVar1) {
                                testing::Message::Message((Message *)in_stack_fffffffffffff540);
                                testing::AssertionResult::failure_message
                                          ((AssertionResult *)0x108a350);
                                testing::internal::AssertHelper::AssertHelper
                                          (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                           (char *)in_stack_fffffffffffff530,
                                           in_stack_fffffffffffff52c,
                                           (char *)in_stack_fffffffffffff520);
                                testing::internal::AssertHelper::operator=
                                          (in_stack_fffffffffffff590,
                                           (Message *)
                                           CONCAT17(in_stack_fffffffffffff58f,
                                                    in_stack_fffffffffffff588));
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)in_stack_fffffffffffff510);
                                testing::Message::~Message((Message *)0x108a3b3);
                              }
                              local_dc = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x108a421);
                              if (local_dc == 0) {
                                local_36c = 0;
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                            in_stack_fffffffffffff528),
                                           (char *)in_stack_fffffffffffff520,
                                           (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                           in_stack_fffffffffffff518),
                                           (int *)in_stack_fffffffffffff510);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
                                if (!bVar1) {
                                  testing::Message::Message((Message *)in_stack_fffffffffffff540);
                                  testing::AssertionResult::failure_message
                                            ((AssertionResult *)0x108a4d8);
                                  testing::internal::AssertHelper::AssertHelper
                                            (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                             (char *)in_stack_fffffffffffff530,
                                             in_stack_fffffffffffff52c,
                                             (char *)in_stack_fffffffffffff520);
                                  testing::internal::AssertHelper::operator=
                                            (in_stack_fffffffffffff590,
                                             (Message *)
                                             CONCAT17(in_stack_fffffffffffff58f,
                                                      in_stack_fffffffffffff588));
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)in_stack_fffffffffffff510);
                                  testing::Message::~Message((Message *)0x108a53b);
                                }
                                local_dc = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x108a5a9);
                                if (local_dc == 0) {
                                  A::reset();
                                  local_3a4 = 0x14;
                                  A::A(&local_3a8,200);
                                  google::
                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                  ::try_emplace<A>((
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (key_type *)
                                                  CONCAT17(in_stack_fffffffffffff51f,
                                                           in_stack_fffffffffffff518),
                                                  (A *)in_stack_fffffffffffff510);
                                  std::
                                  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                                  ::operator=(&local_90,&local_3a0);
                                  testing::AssertionResult::AssertionResult<bool>
                                            (in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                                             (type *)0x108a63b);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    (&local_3b8);
                                  if (!bVar1) {
                                    testing::Message::Message((Message *)in_stack_fffffffffffff540);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((AssertionResult *)
                                               CONCAT17(in_stack_fffffffffffff58f,
                                                        in_stack_fffffffffffff588),
                                               in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                                               (char *)CONCAT17(in_stack_fffffffffffff577,
                                                                in_stack_fffffffffffff570));
                                    std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                                               (char *)in_stack_fffffffffffff530,
                                               in_stack_fffffffffffff52c,
                                               (char *)in_stack_fffffffffffff520);
                                    testing::internal::AssertHelper::operator=
                                              (in_stack_fffffffffffff590,
                                               (Message *)
                                               CONCAT17(in_stack_fffffffffffff58f,
                                                        in_stack_fffffffffffff588));
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)in_stack_fffffffffffff510);
                                    std::__cxx11::string::~string(local_3e8);
                                    testing::Message::~Message((Message *)0x108a739);
                                  }
                                  local_dc = (uint)!bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x108a7ca);
                                  if (local_dc == 0) {
                                    local_3fc = 0x14;
                                    google::
                                    dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                    ::operator->((dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)0x108a7f3);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                                in_stack_fffffffffffff528),
                                               (char *)in_stack_fffffffffffff520,
                                               (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                               in_stack_fffffffffffff518),
                                               (int *)in_stack_fffffffffffff510);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      (&local_3f8);
                                    if (!bVar1) {
                                      testing::Message::Message
                                                ((Message *)in_stack_fffffffffffff540);
                                      testing::AssertionResult::failure_message
                                                ((AssertionResult *)0x108a899);
                                      testing::internal::AssertHelper::AssertHelper
                                                (in_stack_fffffffffffff540,in_stack_fffffffffffff53c
                                                 ,(char *)in_stack_fffffffffffff530,
                                                 in_stack_fffffffffffff52c,
                                                 (char *)in_stack_fffffffffffff520);
                                      testing::internal::AssertHelper::operator=
                                                (in_stack_fffffffffffff590,
                                                 (Message *)
                                                 CONCAT17(in_stack_fffffffffffff58f,
                                                          in_stack_fffffffffffff588));
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)in_stack_fffffffffffff510);
                                      testing::Message::~Message((Message *)0x108a8fc);
                                    }
                                    local_dc = (uint)!bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x108a96a);
                                    if (local_dc == 0) {
                                      local_424 = 200;
                                      google::
                                      dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                      ::operator->((
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)0x108a993);
                                      testing::internal::EqHelper::Compare<int,_A,_nullptr>
                                                ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                                  in_stack_fffffffffffff528),
                                                 (char *)in_stack_fffffffffffff520,
                                                 (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                 in_stack_fffffffffffff518),
                                                 (A *)in_stack_fffffffffffff510);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (local_420);
                                      if (!bVar1) {
                                        testing::Message::Message
                                                  ((Message *)in_stack_fffffffffffff540);
                                        testing::AssertionResult::failure_message
                                                  ((AssertionResult *)0x108aa3d);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (in_stack_fffffffffffff540,
                                                   in_stack_fffffffffffff53c,
                                                   (char *)in_stack_fffffffffffff530,
                                                   in_stack_fffffffffffff52c,
                                                   (char *)in_stack_fffffffffffff520);
                                        testing::internal::AssertHelper::operator=
                                                  (in_stack_fffffffffffff590,
                                                   (Message *)
                                                   CONCAT17(in_stack_fffffffffffff58f,
                                                            in_stack_fffffffffffff588));
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)in_stack_fffffffffffff510);
                                        testing::Message::~Message((Message *)0x108aaa0);
                                      }
                                      local_dc = (uint)!bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x108ab0e);
                                      if (local_dc == 0) {
                                        local_44c = 0x14;
                                        google::
                                        dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                        ::operator[]((
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)in_stack_fffffffffffff510,
                                                  (key_type *)in_stack_fffffffffffff508);
                                        local_450 = 200;
                                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                  ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                                    in_stack_fffffffffffff528),
                                                   (char *)in_stack_fffffffffffff520,
                                                   (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                   in_stack_fffffffffffff518),
                                                   (int *)in_stack_fffffffffffff510);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          (local_448);
                                        if (!bVar1) {
                                          testing::Message::Message
                                                    ((Message *)in_stack_fffffffffffff540);
                                          testing::AssertionResult::failure_message
                                                    ((AssertionResult *)0x108abf0);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (in_stack_fffffffffffff540,
                                                     in_stack_fffffffffffff53c,
                                                     (char *)in_stack_fffffffffffff530,
                                                     in_stack_fffffffffffff52c,
                                                     (char *)in_stack_fffffffffffff520);
                                          testing::internal::AssertHelper::operator=
                                                    (in_stack_fffffffffffff590,
                                                     (Message *)
                                                     CONCAT17(in_stack_fffffffffffff58f,
                                                              in_stack_fffffffffffff588));
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)in_stack_fffffffffffff510);
                                          testing::Message::~Message((Message *)0x108ac53);
                                        }
                                        local_dc = (uint)!bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)0x108acc1);
                                        if (local_dc == 0) {
                                          local_474 = 0;
                                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                    ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                                      in_stack_fffffffffffff528),
                                                     (char *)in_stack_fffffffffffff520,
                                                     (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                     in_stack_fffffffffffff518),
                                                     (int *)in_stack_fffffffffffff510);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            (local_470);
                                          if (!bVar1) {
                                            testing::Message::Message
                                                      ((Message *)in_stack_fffffffffffff540);
                                            testing::AssertionResult::failure_message
                                                      ((AssertionResult *)0x108ad78);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (in_stack_fffffffffffff540,
                                                       in_stack_fffffffffffff53c,
                                                       (char *)in_stack_fffffffffffff530,
                                                       in_stack_fffffffffffff52c,
                                                       (char *)in_stack_fffffffffffff520);
                                            testing::internal::AssertHelper::operator=
                                                      (in_stack_fffffffffffff590,
                                                       (Message *)
                                                       CONCAT17(in_stack_fffffffffffff58f,
                                                                in_stack_fffffffffffff588));
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)in_stack_fffffffffffff510);
                                            testing::Message::~Message((Message *)0x108addb);
                                          }
                                          local_dc = (uint)!bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)0x108ae49);
                                          if (local_dc == 0) {
                                            local_49c = 0;
                                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                      ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                                        in_stack_fffffffffffff528),
                                                       (char *)in_stack_fffffffffffff520,
                                                       (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                       in_stack_fffffffffffff518),
                                                       (int *)in_stack_fffffffffffff510);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              (local_498);
                                            if (!bVar1) {
                                              testing::Message::Message
                                                        ((Message *)in_stack_fffffffffffff540);
                                              testing::AssertionResult::failure_message
                                                        ((AssertionResult *)0x108af00);
                                              testing::internal::AssertHelper::AssertHelper
                                                        (in_stack_fffffffffffff540,
                                                         in_stack_fffffffffffff53c,
                                                         (char *)in_stack_fffffffffffff530,
                                                         in_stack_fffffffffffff52c,
                                                         (char *)in_stack_fffffffffffff520);
                                              testing::internal::AssertHelper::operator=
                                                        (in_stack_fffffffffffff590,
                                                         (Message *)
                                                         CONCAT17(in_stack_fffffffffffff58f,
                                                                  in_stack_fffffffffffff588));
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)in_stack_fffffffffffff510);
                                              testing::Message::~Message((Message *)0x108af63);
                                            }
                                            local_dc = (uint)!bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)0x108afd1);
                                            if (local_dc == 0) {
                                              local_4c4 = 1;
                                              testing::internal::EqHelper::
                                              Compare<int,_int,_nullptr>
                                                        ((char *)CONCAT44(in_stack_fffffffffffff52c,
                                                                          in_stack_fffffffffffff528)
                                                         ,(char *)in_stack_fffffffffffff520,
                                                         (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                         in_stack_fffffffffffff518),
                                                         (int *)in_stack_fffffffffffff510);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool(local_4c0);
                                              if (!bVar1) {
                                                testing::Message::Message
                                                          ((Message *)in_stack_fffffffffffff540);
                                                testing::AssertionResult::failure_message
                                                          ((AssertionResult *)0x108b088);
                                                testing::internal::AssertHelper::AssertHelper
                                                          (in_stack_fffffffffffff540,
                                                           in_stack_fffffffffffff53c,
                                                           (char *)in_stack_fffffffffffff530,
                                                           in_stack_fffffffffffff52c,
                                                           (char *)in_stack_fffffffffffff520);
                                                testing::internal::AssertHelper::operator=
                                                          (in_stack_fffffffffffff590,
                                                           (Message *)
                                                           CONCAT17(in_stack_fffffffffffff58f,
                                                                    in_stack_fffffffffffff588));
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)in_stack_fffffffffffff510
                                                          );
                                                testing::Message::~Message((Message *)0x108b0eb);
                                              }
                                              local_dc = (uint)!bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)0x108b159);
                                              if (local_dc == 0) {
                                                local_4ec = 0;
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool(local_4e8);
                                                if (!bVar1) {
                                                  testing::Message::Message
                                                            ((Message *)in_stack_fffffffffffff540);
                                                  testing::AssertionResult::failure_message
                                                            ((AssertionResult *)0x108b210);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (in_stack_fffffffffffff540,
                                                             in_stack_fffffffffffff53c,
                                                             (char *)in_stack_fffffffffffff530,
                                                             in_stack_fffffffffffff52c,
                                                             (char *)in_stack_fffffffffffff520);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff590,
                                                             (Message *)
                                                             CONCAT17(in_stack_fffffffffffff58f,
                                                                      in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  testing::Message::~Message((Message *)0x108b273);
                                                }
                                                local_dc = (uint)!bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)0x108b2e1);
                                                if (local_dc == 0) {
                                                  A::reset();
                                                  local_524 = 0x14;
                                                  A::A(&local_528,0xc9);
                                                  google::
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::try_emplace<A>((
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (key_type *)
                                                  CONCAT17(in_stack_fffffffffffff51f,
                                                           in_stack_fffffffffffff518),
                                                  (A *)in_stack_fffffffffffff510);
                                                  std::
                                                  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                                                  ::operator=(&local_90,&local_520);
                                                  local_539 = ~local_90.second & 1;
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            (in_stack_fffffffffffff510,
                                                             in_stack_fffffffffffff508,
                                                             (type *)0x108b385);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_538);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((AssertionResult *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588),
                                                               in_stack_fffffffffffff580,
                                                               in_stack_fffffffffffff578,
                                                               (char *)CONCAT17(
                                                  in_stack_fffffffffffff577,
                                                  in_stack_fffffffffffff570));
                                                  std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (in_stack_fffffffffffff540,
                                                             in_stack_fffffffffffff53c,
                                                             (char *)in_stack_fffffffffffff530,
                                                             in_stack_fffffffffffff52c,
                                                             (char *)in_stack_fffffffffffff520);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff590,
                                                             (Message *)
                                                             CONCAT17(in_stack_fffffffffffff58f,
                                                                      in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  std::__cxx11::string::~string(local_570);
                                                  testing::Message::~Message((Message *)0x108b483);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108b514);
                                                  if (local_dc == 0) {
                                                    local_584 = 0x14;
                                                    google::
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::operator->((
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)0x108b53d);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_580);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108b5e3);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              (in_stack_fffffffffffff590,
                                                               (Message *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588));
                                                    testing::internal::AssertHelper::~AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff510);
                                                    testing::Message::~Message((Message *)0x108b646)
                                                    ;
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108b6b4);
                                                  if (local_dc == 0) {
                                                    local_5ac = 200;
                                                    google::
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::operator->((
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)0x108b6dd);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_A,_nullptr>
                                                            ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (A *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_5a8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108b787);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              (in_stack_fffffffffffff590,
                                                               (Message *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588));
                                                    testing::internal::AssertHelper::~AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff510);
                                                    testing::Message::~Message((Message *)0x108b7ea)
                                                    ;
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108b858);
                                                  if (local_dc == 0) {
                                                    local_5d4 = 0x14;
                                                    google::
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::operator[]((
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)in_stack_fffffffffffff510,
                                                  (key_type *)in_stack_fffffffffffff508);
                                                  local_5d8 = 200;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_5d0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108b93a);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              (in_stack_fffffffffffff590,
                                                               (Message *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588));
                                                    testing::internal::AssertHelper::~AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff510);
                                                    testing::Message::~Message((Message *)0x108b99d)
                                                    ;
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108ba0b);
                                                  if (local_dc == 0) {
                                                    local_5fc = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_5f8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108bac2);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              (in_stack_fffffffffffff590,
                                                               (Message *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588));
                                                    testing::internal::AssertHelper::~AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff510);
                                                    testing::Message::~Message((Message *)0x108bb25)
                                                    ;
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108bb93);
                                                  if (local_dc == 0) {
                                                    local_624 = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_620);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108bc4a);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              (in_stack_fffffffffffff590,
                                                               (Message *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588));
                                                    testing::internal::AssertHelper::~AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff510);
                                                    testing::Message::~Message((Message *)0x108bcad)
                                                    ;
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108bd1b);
                                                  if (local_dc == 0) {
                                                    local_64c = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_648);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108bdd2);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              (in_stack_fffffffffffff590,
                                                               (Message *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588));
                                                    testing::internal::AssertHelper::~AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff510);
                                                    testing::Message::~Message((Message *)0x108be35)
                                                    ;
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108bea3);
                                                  if (local_dc == 0) {
                                                    local_674 = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_670);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108bf5a);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              (in_stack_fffffffffffff590,
                                                               (Message *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588));
                                                    testing::internal::AssertHelper::~AssertHelper
                                                              ((AssertHelper *)
                                                               in_stack_fffffffffffff510);
                                                    testing::Message::~Message((Message *)0x108bfbd)
                                                    ;
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108c02b);
                                                  if (local_dc == 0) {
                                                    A::reset();
                                                    local_6ac = 0x1e;
                                                    google::
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::try_emplace<>((
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)in_stack_fffffffffffff510,
                                                  (key_type *)in_stack_fffffffffffff508);
                                                  std::
                                                  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
                                                  ::operator=(&local_90,&local_6a8);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            (in_stack_fffffffffffff510,
                                                             in_stack_fffffffffffff508,
                                                             (type *)0x108c09b);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_6c0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((AssertionResult *)
                                                               CONCAT17(in_stack_fffffffffffff58f,
                                                                        in_stack_fffffffffffff588),
                                                               in_stack_fffffffffffff580,
                                                               in_stack_fffffffffffff578,
                                                               (char *)CONCAT17(
                                                  in_stack_fffffffffffff577,
                                                  in_stack_fffffffffffff570));
                                                  std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (in_stack_fffffffffffff540,
                                                             in_stack_fffffffffffff53c,
                                                             (char *)in_stack_fffffffffffff530,
                                                             in_stack_fffffffffffff52c,
                                                             (char *)in_stack_fffffffffffff520);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff590,
                                                             (Message *)
                                                             CONCAT17(in_stack_fffffffffffff58f,
                                                                      in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  std::__cxx11::string::~string(local_6f0);
                                                  testing::Message::~Message((Message *)0x108c199);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108c22a);
                                                  if (local_dc == 0) {
                                                    local_704 = 0x1e;
                                                    this_00 = google::
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::operator->((
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)0x108c253);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_700);
                                                  uVar2 = bVar1;
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108c2f9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              ((AssertHelper *)this_00,
                                                               (Message *)
                                                               CONCAT17(uVar2,
                                                  in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  testing::Message::~Message((Message *)0x108c356);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108c3c4);
                                                  if (local_dc == 0) {
                                                    local_72c = 0;
                                                    google::
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::operator->((
                                                  dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)0x108c3ed);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_A,_nullptr>
                                                            ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (A *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_728);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108c48b);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              ((AssertHelper *)this_00,
                                                               (Message *)
                                                               CONCAT17(uVar2,
                                                  in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  testing::Message::~Message((Message *)0x108c4e8);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108c556);
                                                  if (local_dc == 0) {
                                                    local_754 = 0x1e;
                                                    google::
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  ::operator[]((
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)in_stack_fffffffffffff510,
                                                  (key_type *)in_stack_fffffffffffff508);
                                                  local_758 = 0;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_750);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108c62c);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              ((AssertHelper *)this_00,
                                                               (Message *)
                                                               CONCAT17(uVar2,
                                                  in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  testing::Message::~Message((Message *)0x108c689);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108c6f7);
                                                  if (local_dc == 0) {
                                                    local_77c = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_778);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    in_stack_fffffffffffff540 =
                                                         (AssertHelper *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x108c7a8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,
                                                               in_stack_fffffffffffff53c,
                                                               (char *)in_stack_fffffffffffff530,
                                                               in_stack_fffffffffffff52c,
                                                               (char *)in_stack_fffffffffffff520);
                                                    testing::internal::AssertHelper::operator=
                                                              ((AssertHelper *)this_00,
                                                               (Message *)
                                                               CONCAT17(uVar2,
                                                  in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  testing::Message::~Message((Message *)0x108c805);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108c873);
                                                  if (local_dc == 0) {
                                                    local_7a4 = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_7a0);
                                                  type = CONCAT13(bVar1,(int3)
                                                  in_stack_fffffffffffff53c);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    in_stack_fffffffffffff530 =
                                                         (
                                                  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                                                  *)testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x108c924);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (in_stack_fffffffffffff540,type,
                                                             (char *)in_stack_fffffffffffff530,
                                                             in_stack_fffffffffffff52c,
                                                             (char *)in_stack_fffffffffffff520);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_00,
                                                             (Message *)
                                                             CONCAT17(uVar2,
                                                  in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  testing::Message::~Message((Message *)0x108c981);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108c9ef);
                                                  if (local_dc == 0) {
                                                    local_7cc = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(
                                                  in_stack_fffffffffffff52c,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_7c8);
                                                  line = CONCAT13(bVar1,(int3)
                                                  in_stack_fffffffffffff52c);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    in_stack_fffffffffffff520 =
                                                         (hasher *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x108caa0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,type,
                                                               (char *)in_stack_fffffffffffff530,
                                                               line,(char *)
                                                  in_stack_fffffffffffff520);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_00,
                                                             (Message *)
                                                             CONCAT17(uVar2,
                                                  in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             in_stack_fffffffffffff510);
                                                  testing::Message::~Message((Message *)0x108cafd);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108cb6b);
                                                  if (local_dc == 0) {
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT44(line,
                                                  in_stack_fffffffffffff528),
                                                  (char *)in_stack_fffffffffffff520,
                                                  (int *)CONCAT17(in_stack_fffffffffffff51f,
                                                                  in_stack_fffffffffffff518),
                                                  (int *)in_stack_fffffffffffff510);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_7f0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_fffffffffffff540)
                                                    ;
                                                    this_01 = (AssertHelper *)
                                                              testing::AssertionResult::
                                                              failure_message((AssertionResult *)
                                                                              0x108cc1c);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_fffffffffffff540,type,
                                                               (char *)in_stack_fffffffffffff530,
                                                               line,(char *)
                                                  in_stack_fffffffffffff520);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_00,
                                                             (Message *)
                                                             CONCAT17(uVar2,
                                                  in_stack_fffffffffffff588));
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (this_01);
                                                  testing::Message::~Message((Message *)0x108cc79);
                                                  }
                                                  local_dc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x108cce4);
                                                  if (local_dc == 0) {
                                                    local_dc = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::~dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                     *)0x108cd09);
  return;
}

Assistant:

TEST(DenseHashMapIfaceTest, TryEmplace)
{
    dense_hash_map<int, A> h;
    h.set_empty_key(0);

    // Test: key does not exist; using user-defined constructor with forwarded argument
    A::reset();
    auto p = h.try_emplace(10, 100);

    ASSERT_TRUE(p.second);
    ASSERT_EQ(10, p.first->first);
    ASSERT_EQ(100, p.first->second);
    ASSERT_EQ(100, h[10]._i);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key exists; using forwarded argument
    A::reset();
    p = h.try_emplace(10, 101);

    ASSERT_FALSE(p.second);
    ASSERT_EQ(10, p.first->first);
    ASSERT_EQ(100, p.first->second);
    ASSERT_EQ(100, h[10]._i);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key does not exist; using move constructor
    A::reset();
    p = h.try_emplace(20, A(200));

    ASSERT_TRUE(p.second);
    ASSERT_EQ(20, p.first->first);
    ASSERT_EQ(200, p.first->second);
    ASSERT_EQ(h[20]._i, 200);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(1, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key exists; using move constructor
    A::reset();
    p = h.try_emplace(20, A(201));

    ASSERT_FALSE(p.second);
    ASSERT_EQ(20, p.first->first);
    ASSERT_EQ(200, p.first->second);
    ASSERT_EQ(h[20]._i, 200);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);

    // Test: key does not exist; using default constructor
    A::reset();
    p = h.try_emplace(30);

    ASSERT_TRUE(p.second);
    ASSERT_EQ(30, p.first->first);
    ASSERT_EQ(0, p.first->second);
    ASSERT_EQ(h[30]._i, 0);
    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}